

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountShader::shadePrimitives
          (OutputCountShader *this,GeometryEmitter *output,int verticesIn,PrimitivePacket *packets,
          int numPackets,int invocationID)

{
  int iVar1;
  int iVar2;
  int iVar3;
  VertexPacket *pVVar4;
  int i;
  long lVar5;
  int iVar6;
  PrimitivePacket *pPVar7;
  float fVar8;
  float local_78 [4];
  Vec4 local_68;
  OutputCountShader *local_50;
  PrimitivePacket *local_48;
  ulong local_40;
  ulong local_38;
  
  if (0 < numPackets) {
    iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
    iVar2 = this->m_patternMaxEmitCount;
    local_40 = (ulong)(uint)numPackets;
    local_38 = 0;
    local_50 = this;
    local_48 = packets;
    do {
      iVar3 = (local_50->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_48[local_38].primitiveIDIn];
      if (1 < iVar3) {
        pPVar7 = local_48 + local_38;
        pVVar4 = pPVar7->vertices[0];
        iVar6 = 0;
        do {
          fVar8 = ((float)iVar6 + (float)iVar6) * (2.0 / (float)iVar2);
          local_78[0] = fVar8;
          local_78[1] = 0.0;
          local_78[2] = 0.0;
          local_78[3] = 0.0;
          local_68.m_data[0] = 0.0;
          local_68.m_data[1] = 0.0;
          local_68.m_data[2] = 0.0;
          local_68.m_data[3] = 0.0;
          lVar5 = 0;
          do {
            local_68.m_data[lVar5] = (pVVar4->position).m_data[lVar5] + local_78[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          rr::GeometryEmitter::EmitVertex
                    (output,&local_68,pVVar4->pointSize,pVVar4->outputs,pPVar7->primitiveIDIn);
          local_78[0] = fVar8;
          local_78[1] = 2.0 / (float)iVar1;
          local_78[2] = 0.0;
          local_78[3] = 0.0;
          local_68.m_data[0] = 0.0;
          local_68.m_data[1] = 0.0;
          local_68.m_data[2] = 0.0;
          local_68.m_data[3] = 0.0;
          lVar5 = 0;
          do {
            local_68.m_data[lVar5] = (pVVar4->position).m_data[lVar5] + local_78[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          rr::GeometryEmitter::EmitVertex
                    (output,&local_68,pVVar4->pointSize,pVVar4->outputs,pPVar7->primitiveIDIn);
          iVar6 = iVar6 + 1;
        } while (iVar6 != iVar3 / 2);
      }
      rr::GeometryEmitter::EndPrimitive(output);
      local_38 = local_38 + 1;
    } while (local_38 != local_40);
  }
  return;
}

Assistant:

void OutputCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);
	DE_UNREF(invocationID);

	const float rowHeight	= 2.0f / (float)m_patternLength;
	const float colWidth	= 2.0f / (float)m_patternMaxEmitCount;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		// Create triangle strip at this point
		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];
		const int				emitCount	= m_spec.pattern[packets[packetNdx].primitiveIDIn];

		for (int ndx = 0; ndx < emitCount / 2; ++ndx)
		{
			output.EmitVertex(vertex->position + tcu::Vec4(2 * (float)ndx * colWidth, 0.0,       0.0, 0.0), vertex->pointSize, vertex->outputs, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position + tcu::Vec4(2 * (float)ndx * colWidth, rowHeight, 0.0, 0.0), vertex->pointSize, vertex->outputs, packets[packetNdx].primitiveIDIn);
		}
		output.EndPrimitive();
	}
}